

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O0

int HTS_feof(HTS_File *fp)

{
  char *in_RDI;
  HTS_Data *d;
  uint local_4;
  
  if (in_RDI == (char *)0x0) {
    local_4 = 1;
  }
  else if (*in_RDI == '\0') {
    local_4 = feof(*(FILE **)(in_RDI + 8));
  }
  else if (*in_RDI == '\x01') {
    local_4 = (uint)(*(ulong *)(*(long *)(in_RDI + 8) + 8) <=
                    *(ulong *)(*(long *)(in_RDI + 8) + 0x10));
  }
  else {
    HTS_error(0,"HTS_feof: Unknown file type.\n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int HTS_feof(HTS_File * fp)
{
   if (fp == NULL) {
      return 1;
   } else if (fp->type == HTS_FILE) {
      return feof((FILE *) fp->pointer);
   } else if (fp->type == HTS_DATA) {
      HTS_Data *d = (HTS_Data *) fp->pointer;
      return d->size <= d->index ? 1 : 0;
   }
   HTS_error(0, "HTS_feof: Unknown file type.\n");
   return 1;
}